

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testHash(char *name)

{
  uint uVar1;
  int iVar2;
  HashInfo *info;
  long lVar3;
  
  info = (HashInfo *)0x0;
  lVar3 = 0;
  do {
    iVar2 = strcasecmp(name,*(char **)((long)&g_hashes[0].name + lVar3));
    if (iVar2 == 0) {
      info = (HashInfo *)((long)&g_hashes[0].hash + lVar3);
      break;
    }
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x1220);
  if (info != (HashInfo *)0x0) {
    uVar1 = info->hashbits;
    g_hashUnderTest = info;
    switch(uVar1 - 0x20 >> 5 | uVar1 << 0x1b) {
    case 0:
      test<unsigned_int>((hashfunc<unsigned_int>)info->hash,info);
      return;
    case 1:
      test<unsigned_long>((hashfunc<unsigned_long>)info->hash,info);
      return;
    default:
      printf("Invalid hash bit width %d for hash \'%s\'",(ulong)uVar1,info->name);
      return;
    case 3:
      test<Blob<128>>((hashfunc<Blob<128>_>)info->hash,info);
      return;
    case 4:
      test<Blob<160>>((hashfunc<Blob<160>_>)info->hash,info);
      return;
    case 6:
      test<Blob<224>>((hashfunc<Blob<224>_>)info->hash,info);
      return;
    case 7:
      test<Blob<256>>((hashfunc<Blob<256>_>)info->hash,info);
      return;
    }
  }
  printf("Invalid hash \'%s\' specified\n",name);
  return;
}

Assistant:

void testHash ( const char * name )
{
  HashInfo * pInfo = findHash(name);

  if(pInfo == NULL)
  {
    printf("Invalid hash '%s' specified\n", name);
    return;
  }
  else
  {
    g_hashUnderTest = pInfo;

    if(pInfo->hashbits == 32)
    {
      test<uint32_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 64)
    {
      test<uint64_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 128)
    {
      test<uint128_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 160)
    {
      test<Blob<160>>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 224)
    {
      test<Blob<224>>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 256)
    {
      test<uint256_t>( pInfo->hash, pInfo );
    }
    else
    {
      printf("Invalid hash bit width %d for hash '%s'",
             pInfo->hashbits, pInfo->name);
    }
  }
}